

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O2

uint32_t rest_rpc::MD5::MD5CE::CalcF(uint32_t i,uint32_t b,uint32_t c,uint32_t d)

{
  if (i < 0x10) {
    c = (c ^ d) & b;
  }
  else {
    if (i < 0x20) {
      return c ^ (b ^ c) & d;
    }
    if (i < 0x30) {
      c = c ^ b;
    }
    else {
      d = ~d | b;
    }
  }
  return c ^ d;
}

Assistant:

static uint32_t CalcF(const uint32_t i, const uint32_t b, const uint32_t c,
                        const uint32_t d) {
    //    DCHECK_LT(i, 64u);
    if (i < 16) {
      return d ^ (b & (c ^ d));
    } else if (i < 32) {
      return c ^ (d & (b ^ c));
    } else if (i < 48) {
      return b ^ c ^ d;
    } else {
      return c ^ (b | (~d));
    }
  }